

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  processingInstructionSAXFunc p_Var3;
  xmlType xVar4;
  int iVar5;
  uint val;
  int iVar6;
  xmlCatalogAllow xVar7;
  xmlChar *pxVar8;
  byte *str1;
  ulong uVar9;
  xmlChar *pxVar10;
  void *pvVar11;
  long lVar12;
  xmlParserInputPtr pxVar13;
  xmlChar *in_R8;
  byte *pbVar14;
  byte *pbVar15;
  ulong uVar16;
  int l;
  xmlChar *local_40;
  int local_34;
  
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar13 = ctxt->input;
    pxVar8 = pxVar13->cur;
    if (*pxVar8 != '?') {
      return;
    }
    lVar12 = 1;
    iVar5 = 1;
  }
  else {
    if (ctxt->mlType != XML_TYPE_XML) {
      return;
    }
    pxVar13 = ctxt->input;
    pxVar8 = pxVar13->cur;
    if (*pxVar8 != '<') {
      return;
    }
    if (pxVar8[1] != '?') {
      return;
    }
    lVar12 = 2;
    iVar5 = 2;
  }
  iVar6 = pxVar13->id;
  xVar2 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar13->cur = pxVar8 + lVar12;
  pxVar13->col = pxVar13->col + iVar5;
  if (pxVar8[lVar12] == '\0') {
    xmlParserInputGrow(pxVar13,0xfa);
  }
  if (ctxt->progressive == 0) {
    pxVar13 = ctxt->input;
    if ((500 < (long)pxVar13->cur - (long)pxVar13->base) &&
       ((long)pxVar13->end - (long)pxVar13->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar8 = xmlParsePITarget(ctxt);
  if (pxVar8 != (xmlChar *)0x0) {
    xVar4 = ctxt->mlType;
    if (xVar4 == XML_TYPE_SML) {
      pxVar13 = ctxt->input;
      if ((*pxVar13->cur == ';') || (*pxVar13->cur == '\n')) {
LAB_0015d54d:
        if (iVar6 != pxVar13->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "PI declaration doesn\'t start and stop in the same entity\n");
          xVar4 = ctxt->mlType;
          pxVar13 = ctxt->input;
        }
        pxVar10 = pxVar13->cur;
        pxVar13->cur = pxVar10 + (ulong)(xVar4 == XML_TYPE_XML) + 1;
        pxVar13->col = (uint)(xVar4 == XML_TYPE_XML) + pxVar13->col + 1;
        if (pxVar10[(ulong)(xVar4 == XML_TYPE_XML) + 1] == '\0') {
          xmlParserInputGrow(pxVar13,0xfa);
        }
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var3 = ctxt->sax->processingInstruction, p_Var3 != (processingInstructionSAXFunc)0x0))
        {
          (*p_Var3)(ctxt->userData,pxVar8,(xmlChar *)0x0);
        }
        goto LAB_0015d9eb;
      }
    }
    else if (xVar4 == XML_TYPE_XML) {
      pxVar13 = ctxt->input;
      if ((*pxVar13->cur == '?') && (pxVar13->cur[1] == '>')) goto LAB_0015d54d;
    }
    uVar9 = 100;
    str1 = (byte *)(*xmlMallocAtomic)(100);
    if (str1 == (byte *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      goto LAB_0015d9f4;
    }
    local_34 = iVar6;
    iVar5 = xmlSkipBlankChars(ctxt);
    if (iVar5 == 0) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar8);
    }
    local_40 = pxVar8;
    val = xmlCurrentChar(ctxt,&l);
    iVar5 = 0;
    uVar16 = 0;
    while (pxVar8 = local_40, pbVar14 = str1, 0xff < (int)val) {
      if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) goto LAB_0015d81f;
LAB_0015d68d:
      if (ctxt->mlType != XML_TYPE_SML) {
        if ((ctxt->mlType == XML_TYPE_XML) && ((val != 0x3f || (ctxt->input->cur[1] != '>'))))
        goto LAB_0015d6cb;
        goto LAB_0015d81f;
      }
      if ((val == 10) || (val == 0x3b)) goto LAB_0015d81f;
LAB_0015d6cb:
      if (uVar9 <= uVar16 + 5) {
        uVar9 = uVar9 * 2;
        pbVar14 = (byte *)(*xmlRealloc)(str1,uVar9);
        if (pbVar14 == (byte *)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          goto LAB_0015d94c;
        }
      }
      if (iVar5 < 0x32) {
        iVar5 = iVar5 + 1;
      }
      else {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          (*xmlFree)(pbVar14);
          return;
        }
        iVar5 = 0;
        if ((10000000 < uVar16) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015d831;
      }
      if (l == 1) {
        pbVar14[uVar16] = (byte)val;
        uVar16 = uVar16 + 1;
      }
      else {
        iVar6 = xmlCopyCharMultiByte(pbVar14 + uVar16,val);
        uVar16 = uVar16 + (long)iVar6;
      }
      pxVar13 = ctxt->input;
      if (*pxVar13->cur == '\n') {
        pxVar13->line = pxVar13->line + 1;
        pxVar13->col = 1;
      }
      else {
        pxVar13->col = pxVar13->col + 1;
      }
      pxVar13->cur = pxVar13->cur + l;
      val = xmlCurrentChar(ctxt,&l);
      str1 = pbVar14;
      if (val == 0) {
        if (ctxt->progressive == 0) {
          pxVar13 = ctxt->input;
          if (((((long)pxVar13->cur - (long)pxVar13->base < 0x1f5) ||
               (499 < (long)pxVar13->end - (long)pxVar13->cur)) ||
              (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
             ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
            xmlGROW(ctxt);
          }
        }
        val = xmlCurrentChar(ctxt,&l);
      }
    }
    if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
    goto LAB_0015d68d;
LAB_0015d81f:
    if ((10000000 < uVar16) && ((ctxt->options & 0x80000) == 0)) {
LAB_0015d831:
      xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",local_40);
      str1 = pbVar14;
LAB_0015d94c:
      (*xmlFree)(str1);
      ctxt->instate = xVar2;
      return;
    }
    str1[uVar16] = 0;
    if ((val != 0x3f && ctxt->mlType == XML_TYPE_XML) ||
       (((ctxt->mlType == XML_TYPE_SML && (val != 10)) && (val != 0x3b)))) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_40);
      goto LAB_0015d9df;
    }
    pxVar13 = ctxt->input;
    if (local_34 != pxVar13->id) {
      xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                     "PI declaration doesn\'t start and stop in the same entity\n");
      pxVar13 = ctxt->input;
    }
    pxVar10 = pxVar13->cur;
    pxVar13->cur = pxVar10 + 2;
    pxVar13->col = pxVar13->col + 2;
    if (pxVar10[2] == '\0') {
      xmlParserInputGrow(pxVar13,0xfa);
    }
    if (((1 < (uint)xVar2) ||
        (iVar5 = xmlStrEqual(pxVar8,(xmlChar *)"oasis-xml-catalog"), iVar5 == 0)) ||
       (xVar7 = xmlCatalogGetDefaults(), (xVar7 & ~XML_CATA_ALLOW_GLOBAL) != XML_CATA_ALLOW_DOCUMENT
       )) goto LAB_0015d9b6;
    while (((ulong)*pbVar14 < 0x21 && ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0))) {
      pbVar14 = pbVar14 + 1;
    }
    iVar5 = xmlStrncmp(pbVar14,"catalog",7);
    if (iVar5 != 0) {
LAB_0015d98d:
      pxVar10 = (xmlChar *)0x0;
      goto LAB_0015d990;
    }
    for (pbVar14 = pbVar14 + 9; uVar9 = (ulong)pbVar14[-2], uVar9 < 0x3e; pbVar14 = pbVar14 + 1) {
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x3d) goto LAB_0015da2a;
        break;
      }
    }
    goto LAB_0015d9b6;
  }
  xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
  goto LAB_0015d9eb;
LAB_0015da2a:
  uVar9 = (ulong)pbVar14[-1];
  if (0x27 < uVar9) goto LAB_0015d98d;
  if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
    if ((0x8400000000U >> (uVar9 & 0x3f) & 1) != 0) {
      iVar5 = -1;
      pbVar15 = pbVar14;
      goto LAB_0015da5f;
    }
    goto LAB_0015d98d;
  }
  pbVar14 = pbVar14 + 1;
  goto LAB_0015da2a;
  while (bVar1 != pbVar14[-1]) {
LAB_0015da5f:
    bVar1 = *pbVar15;
    pbVar15 = pbVar15 + 1;
    iVar5 = iVar5 + 1;
    if (bVar1 == 0) break;
  }
  if (bVar1 == 0) {
    pxVar10 = (xmlChar *)0x0;
    pxVar8 = local_40;
  }
  else {
    pxVar10 = xmlStrndup(pbVar14,iVar5);
    pxVar8 = local_40;
    for (; uVar9 = (ulong)*pbVar15, uVar9 < 0x21; pbVar15 = pbVar15 + 1) {
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0) {
          if (pxVar10 == (xmlChar *)0x0) goto LAB_0015d9b6;
          pvVar11 = xmlCatalogAddLocal(ctxt->catalogs,pxVar10);
          ctxt->catalogs = pvVar11;
          goto LAB_0015d9aa;
        }
        break;
      }
    }
  }
LAB_0015d990:
  xmlWarningMsg(ctxt,XML_WAR_CATALOG_PI,"Catalog PI syntax error: %s\n",str1,in_R8);
  if (pxVar10 != (xmlChar *)0x0) {
LAB_0015d9aa:
    (*xmlFree)(pxVar10);
  }
LAB_0015d9b6:
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
     (p_Var3 = ctxt->sax->processingInstruction, p_Var3 != (processingInstructionSAXFunc)0x0)) {
    (*p_Var3)(ctxt->userData,pxVar8,str1);
  }
LAB_0015d9df:
  (*xmlFree)(str1);
LAB_0015d9eb:
  if (ctxt->instate == XML_PARSER_EOF) {
    return;
  }
LAB_0015d9f4:
  ctxt->instate = xVar2;
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if (CMP2_MLI(CUR_PTR, '<', '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP_MLI(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
	        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP_MLI(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   (   (ISXML && ((cur != '?') || (NXT(1) != '>')))
		    || (ISSML && (cur != '\n') && (cur != ';')))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
                    if ((len > XML_MAX_TEXT_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        ctxt->instate = state;
                        return;
                    }
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
            if ((len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                  "PI %s too big found", target);
                xmlFree(buf);
                ctxt->instate = state;
                return;
            }
	    buf[len] = 0;
	    if (   (ISXML && (cur != '?'))
	        || (ISSML && (cur != '\n') && (cur != ';'))) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}